

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CreateReferencedPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  ulong count;
  uint i;
  ulong uVar6;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  piVar4 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  if (piVar4 != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10bd,"(this->GetReferencedPropertyIdMap() == nullptr)",
                                "this->GetReferencedPropertyIdMap() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetReferencedPropertyIdCount(this);
  if (uVar3 != 0) {
    count = (ulong)uVar3;
    local_48 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x10c1;
    data.plusSize = count;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_48);
    piVar4 = Memory::AllocateArray<Memory::Recycler,int,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
              ((FunctionProxy *)this,piVar4);
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      piVar4 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                         ((FunctionProxy *)this);
      piVar4[uVar6] = -1;
    }
  }
  return;
}

Assistant:

void FunctionBody::CreateReferencedPropertyIdMap()
    {
        Assert(this->GetReferencedPropertyIdMap() == nullptr);
        uint count = this->GetReferencedPropertyIdCount();
        if (count!= 0)
        {
            this->SetReferencedPropertyIdMap(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), PropertyId, count));
#if DBG
            for (uint i = 0; i < count; i++)
            {
                this->GetReferencedPropertyIdMap()[i] = Js::Constants::NoProperty;
            }
#endif
        }
    }